

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_bind_string.c
# Opt level: O0

int mpt_output_bind_string(mpt_output *out,char *descr)

{
  int iVar1;
  ssize_t sVar2;
  bool bVar3;
  int local_38;
  int local_34;
  int dim;
  int len;
  anon_struct_6_2_43cb1f44 bnd;
  mpt_msgtype mt;
  mpt_strdest str;
  char *descr_local;
  mpt_output *out_local;
  
  local_38 = 1;
  if (out == (mpt_output *)0x0) {
    out_local._4_4_ = -1;
  }
  else {
    dim._0_1_ = 0;
    dim._1_1_ = 7;
    len._0_1_ = '\x01';
    dim._3_1_ = '\x01';
    dim._2_1_ = '\x01';
    len._1_1_ = 0;
    bnd.src.dim = '\x03';
    len._2_1_ = '\f';
    len._3_1_ = 0x30;
    str = (mpt_strdest)descr;
    if (descr == (char *)0x0) {
      len._3_1_ = 0x31;
      iVar1 = (*out->_vptr->await)(out,(_func_int_void_ptr_mpt_message_ptr *)0x0,(void *)0x0);
      if (iVar1 < 0) {
        out_local._4_4_ = -2;
      }
      else {
        sVar2 = (*out->_vptr->push)(out,2,(void *)((long)&len + 2));
        out_local._4_4_ = (int)sVar2;
        if (-1 < out_local._4_4_) {
          sVar2 = (*out->_vptr->push)(out,0,(void *)0x0);
          out_local._4_4_ = (int)sVar2;
          if (out_local._4_4_ < 0) {
            (*out->_vptr->push)(out,1,(void *)0x0);
          }
          else {
            out_local._4_4_ = 0;
          }
        }
      }
    }
    else {
      do {
        while( true ) {
          while( true ) {
            local_34 = mpt_string_dest(&bnd,0x3a,str);
            if (local_34 == 0) goto LAB_0010b0af;
            if (local_34 < 0) {
              mpt_output_log(out,"mpt_output_bind_string",3,"%s: %d: %s","bad data destination",
                             (byte)dim + 1,str);
              return local_38 + -1;
            }
            str = (mpt_strdest)((long)str + (long)local_34);
            if (bnd.src.dim != '\0') break;
            mpt_output_log(out,"mpt_output_bind_string",3,"%s: %d: %s","identical data destination",
                           (byte)dim + 1,(long)str - (long)local_34);
          }
          if ((bnd.src.dim & 1) != 0) {
            dim._2_1_ = bnd.src.state;
          }
          if ((bnd.src.dim & 2) != 0) {
            dim._3_1_ = bnd.dst.lay;
          }
          if ((bnd.src.dim & 4) != 0) {
            len._0_1_ = bnd.dst.grf;
          }
          if (((dim._2_1_ != '\0') && (dim._3_1_ != '\0')) && ((uint8_t)len != '\0')) break;
          mpt_output_log(out,"mpt_output_bind_string",3,"%s: %d: %s","illegal data destination",
                         (byte)dim + 1,(long)str - (long)local_34);
        }
        if (len._2_1_ != '\0') {
          iVar1 = (*out->_vptr->await)(out,(_func_int_void_ptr_mpt_message_ptr *)0x0,(void *)0x0);
          if (iVar1 < 0) {
            return -2;
          }
          sVar2 = (*out->_vptr->push)(out,2,(void *)((long)&len + 2));
          if ((int)sVar2 < 0) {
            return (int)sVar2;
          }
          len._2_1_ = '\0';
        }
        dim._0_1_ = 0;
        len._1_1_ = 0;
        sVar2 = (*out->_vptr->push)(out,6,&dim);
        local_34 = (int)sVar2;
        if (local_34 < 0) break;
        dim._0_1_ = (byte)local_38;
        len._1_1_ = 1;
        sVar2 = (*out->_vptr->push)(out,6,&dim);
        local_34 = (int)sVar2;
        if (local_34 < 0) break;
        bnd.src.dim = '\x03';
        local_34 = local_38;
        bVar3 = local_38 != 0xff;
        local_38 = local_38 + 1;
      } while (bVar3);
LAB_0010b0af:
      if ((local_34 < 0) || (sVar2 = (*out->_vptr->push)(out,0,(void *)0x0), sVar2 < 0)) {
        (*out->_vptr->push)(out,1,(void *)0x0);
        out_local._4_4_ = -1;
      }
      else {
        out_local._4_4_ = local_34;
      }
    }
  }
  return out_local._4_4_;
}

Assistant:

extern int mpt_output_bind_string(MPT_INTERFACE(output) *out, const char *descr)
{
	MPT_STRUCT(strdest) str;
	MPT_STRUCT(msgtype) mt;
	struct {
		MPT_STRUCT(valsrc)  src;
		MPT_STRUCT(laydest) dst;
	} bnd;
	int len, dim = 1;
	
	if (!out) {
		return MPT_ERROR(BadArgument);
	}
	
	bnd.src.dim = 0;
	bnd.src.state = MPT_DATASTATE(All);
	
	bnd.dst.lay = bnd.dst.grf = bnd.dst.wld = 1;
	bnd.dst.dim = 0;
	
	str.change = 3;
	
	mt.cmd = MPT_MESGTYPE(Graphic);
	mt.arg = MPT_MESGGRF(BindingAdd);
	
	if (!descr) {
		mt.arg = MPT_MESGGRF(BindingClear);
		if (out->_vptr->await(out, 0, 0) < 0) {
			return -2;
		}
		if ((len = out->_vptr->push(out, sizeof(mt), &mt)) < 0) {
			return len;
		}
		if ((len = out->_vptr->push(out, 0, 0)) < 0) {
			out->_vptr->push(out, 1, 0);
			return len;
		}
		return 0;
	}
	/* read binding description string */
	while ((len = mpt_string_dest(&str, ':', descr))) {
		if (len < 0) {
			(void) mpt_output_log(out, __func__, MPT_LOG(Error), "%s: %d: %s",
			                      MPT_tr("bad data destination"), bnd.src.dim+1, descr);
			return dim - 1;
		}
		descr += len;
		if (!str.change) {
			(void) mpt_output_log(out, __func__, MPT_LOG(Error), "%s: %d: %s",
			                       MPT_tr("identical data destination"), bnd.src.dim+1, descr-len);
			continue;
		}
		if (str.change & 1) bnd.dst.lay = str.val[0];
		if (str.change & 2) bnd.dst.grf = str.val[1];
		if (str.change & 4) bnd.dst.wld = str.val[2];
		
		if (!bnd.dst.lay || !bnd.dst.grf || !bnd.dst.wld) {
			(void) mpt_output_log(out, __func__, MPT_LOG(Error), "%s: %d: %s",
			                       MPT_tr("illegal data destination"), bnd.src.dim+1, descr - len);
			continue;
		}
		/* register/write header on first occasion */
		if (mt.cmd) {
			if (out->_vptr->await(out, 0, 0) < 0) {
				return -2;
			}
			if ((len = out->_vptr->push(out, sizeof(mt), &mt)) < 0) {
				return len;
			}
			mt.cmd = 0;
		}
		/* append x/y data bindings */
		bnd.src.dim = 0;
		bnd.dst.dim = 0;
		if ((len = out->_vptr->push(out, sizeof(bnd), &bnd)) < 0) break;
		bnd.src.dim = dim;
		bnd.dst.dim = 1;
		if ((len = out->_vptr->push(out, sizeof(bnd), &bnd)) < 0) break;
		
		str.change = 3;
		
		if ((len = dim++) == UINT8_MAX) break;
	}
	/* clear message data and registration */
	if (len < 0 || out->_vptr->push(out, 0, 0) < 0) {
		out->_vptr->push(out, 1, 0);
		return -1;
	}
	return len;
}